

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

real __thiscall
fasttext::SoftmaxLoss::forward
          (SoftmaxLoss *this,vector<int,_std::allocator<int>_> *targets,int32_t targetIndex,
          State *state,real lr,bool backprop)

{
  int iVar1;
  Vector *this_00;
  Vector *pVVar2;
  const_reference pvVar3;
  int64_t iVar4;
  real *prVar5;
  element_type *peVar6;
  long in_RCX;
  real a;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  State *in_RDI;
  byte in_R8B;
  float in_XMM0_Da;
  double dVar7;
  real alpha;
  real label;
  int32_t i;
  int32_t osz;
  int32_t target;
  int64_t in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  Matrix *in_stack_ffffffffffffff98;
  int64_t i_00;
  Matrix *A;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  float fVar8;
  int local_34;
  
  computeOutput((SoftmaxLoss *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI)
  ;
  if (in_EDX < 0) {
    __assert_fail("targetIndex >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/loss.cc"
                  ,0x16b,
                  "virtual real fasttext::SoftmaxLoss::forward(const std::vector<int32_t> &, int32_t, Model::State &, real, bool)"
                 );
  }
  this_00 = (Vector *)(long)in_EDX;
  pVVar2 = (Vector *)std::vector<int,_std::allocator<int>_>::size(in_RSI);
  if (pVVar2 <= this_00) {
    __assert_fail("targetIndex < targets.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/loss.cc"
                  ,0x16c,
                  "virtual real fasttext::SoftmaxLoss::forward(const std::vector<int32_t> &, int32_t, Model::State &, real, bool)"
                 );
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)in_EDX);
  iVar1 = *pvVar3;
  if ((in_R8B & 1) != 0) {
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x19ffa2);
    iVar4 = Matrix::size(in_stack_ffffffffffffff98,
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    for (local_34 = 0; local_34 < (int)iVar4; local_34 = local_34 + 1) {
      i_00 = 0;
      A = (Matrix *)0x3ff0000000000000;
      if (local_34 != iVar1) {
        A = (Matrix *)0x0;
      }
      in_stack_ffffffffffffff90 = (float)(double)A;
      in_stack_ffffffffffffff94 = in_XMM0_Da;
      prVar5 = Vector::operator[]((Vector *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff90),
                                  in_stack_ffffffffffffff88);
      fVar8 = in_stack_ffffffffffffff94 * (in_stack_ffffffffffffff90 - *prVar5);
      a = (real)((ulong)(in_RCX + 0x40) >> 0x20);
      std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      Vector::addRow(this_00,A,i_00,a);
      peVar6 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1a0092);
      (*peVar6->_vptr_Matrix[3])((ulong)(uint)fVar8,peVar6,in_RCX + 0x10,(long)local_34);
    }
  }
  prVar5 = Vector::operator[]((Vector *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff88);
  dVar7 = Loss::log((Loss *)in_RDI,(double)(ulong)(uint)*prVar5);
  return -SUB84(dVar7,0);
}

Assistant:

real SoftmaxLoss::forward(
    const std::vector<int32_t>& targets,
    int32_t targetIndex,
    Model::State& state,
    real lr,
    bool backprop) {
  computeOutput(state);

  assert(targetIndex >= 0);
  assert(targetIndex < targets.size());
  int32_t target = targets[targetIndex];

  if (backprop) {
    int32_t osz = wo_->size(0);
    for (int32_t i = 0; i < osz; i++) {
      real label = (i == target) ? 1.0 : 0.0;
      real alpha = lr * (label - state.output[i]);
      state.grad.addRow(*wo_, i, alpha);
      wo_->addVectorToRow(state.hidden, i, alpha);
    }
  }
  return -log(state.output[target]);
}